

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O3

void Abc_ObjPrintNeighborhood_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes,int depth)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  
  if (-1 < depth && (char)((*(uint *)&pObj->field_0x14 & 0x40) >> 6) == '\0') {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x40;
    uVar1 = vNodes->nSize;
    if (uVar1 == vNodes->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = 0x10;
      }
      else {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar3 = vNodes->pArray;
    }
    iVar2 = vNodes->nSize;
    vNodes->nSize = iVar2 + 1;
    ppvVar3[iVar2] = pObj;
    Abc_ObjPrint(_stdout,pObj);
    if (0 < (pObj->vFanouts).nSize) {
      lVar4 = 0;
      do {
        Abc_ObjPrintNeighborhood_rec
                  ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]],vNodes,
                   depth + -1);
        lVar4 = lVar4 + 1;
      } while (lVar4 < (pObj->vFanouts).nSize);
    }
    if (0 < (pObj->vFanins).nSize) {
      lVar4 = 0;
      do {
        Abc_ObjPrintNeighborhood_rec
                  ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]],vNodes,
                   depth + -1);
        lVar4 = lVar4 + 1;
      } while (lVar4 < (pObj->vFanins).nSize);
    }
  }
  return;
}

Assistant:

static void Abc_ObjPrintNeighborhood_rec( Abc_Obj_t *pObj, Vec_Ptr_t *vNodes, int depth ) {
  Abc_Obj_t *pObj2;
  int i;
  
  if (pObj->fMarkC || depth < 0) return;

  pObj->fMarkC = 1;
  Vec_PtrPush( vNodes, pObj );

  Abc_ObjPrint( stdout, pObj );

  Abc_ObjForEachFanout(pObj, pObj2, i) {
    Abc_ObjPrintNeighborhood_rec( pObj2, vNodes, depth-1 );
  }
  Abc_ObjForEachFanin(pObj, pObj2, i) {
    Abc_ObjPrintNeighborhood_rec( pObj2, vNodes, depth-1 );
  }
}